

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_memory.cpp
# Opt level: O2

ObjInfo * __thiscall GCHeap::find(GCHeap *this,void *ptr)

{
  ObjInfo *pOVar1;
  ObjInfo *pOVar2;
  
  Mutex::EnterCriticalSection();
  pOVar1 = (ObjInfo *)(this->mObjects).mList.mHead.mNext;
  pOVar2 = (ObjInfo *)0x0;
  if (pOVar1 != (ObjInfo *)&(this->mObjects).mList.mTail) {
    pOVar2 = pOVar1;
  }
  while ((pOVar2 != (ObjInfo *)0x0 &&
         ((ptr < pOVar2->ptr || ((void *)((long)pOVar2->ptr + (ulong)pOVar2->size) <= ptr))))) {
    pOVar2 = (ObjInfo *)(pOVar2->super_Node).mNext;
    if ((pOVar2->super_Node).mNext == (Node *)0x0) {
      pOVar2 = (ObjInfo *)0x0;
    }
  }
  Mutex::ExitCriticalSection();
  return pOVar2;
}

Assistant:

GCHeap::ObjInfo *GCHeap::find( void *ptr )
{
	Mutex::EnterCriticalSection();
	ObjInfo *obj = mObjects.getHead();
	while ( obj != NULL )
	{
		if ( ptr >= obj->ptr && (uint8_t*)ptr < (uint8_t*)obj->ptr + obj->size )
		{
			Mutex::ExitCriticalSection();
			return obj;
		}

		obj = mObjects.next( obj );
	}

	Mutex::ExitCriticalSection();

	return NULL;
}